

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::ShiftRight_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int nValue_00;
  int32 nResult;
  uint32 nShift;
  int32 nValue;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  undefined8 local_10;
  
  iVar2 = JavascriptConversion::ToInt32(aLeft,scriptContext);
  uVar3 = JavascriptConversion::ToUInt32(aRight,scriptContext);
  nValue_00 = iVar2 >> ((byte)uVar3 & 0x1f);
  bVar1 = TaggedInt::IsOverflow(nValue_00);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)nValue_00,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(nValue_00);
  }
  return local_10;
}

Assistant:

Var JavascriptMath::ShiftRight_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_ShiftRight_Full);
            int32 nValue    = JavascriptConversion::ToInt32(aLeft, scriptContext);
            uint32 nShift   = JavascriptConversion::ToUInt32(aRight, scriptContext);

            int32 nResult   = nValue >> (nShift & 0x1F);

            return JavascriptNumber::ToVar(nResult,scriptContext);
            JIT_HELPER_END(Op_ShiftRight_Full);
        }